

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O1

void kernel::ApplyHash<HashWriter>
               (HashWriter *hash_obj,Txid *hash,
               map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
               *outputs)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  Coin coin;
  COutPoint outpoint;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  direct_or_indirect local_90;
  uint local_74;
  undefined4 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  _Rb_tree_color local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = (outputs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(outputs->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_48 = p_Var1[1]._M_color;
      local_68 = *(undefined8 *)(hash->m_wrapped).super_base_blob<256U>.m_data._M_elems;
      uStack_60 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
      local_58 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
      uStack_50 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
      local_98 = p_Var1[1]._M_parent;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_90.indirect_contents,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p_Var1[1]._M_left);
      local_70 = *(undefined4 *)&p_Var1[2]._M_left;
      CSHA256::Write(&hash_obj->ctx,(uchar *)&local_68,0x20);
      local_a0._0_4_ = local_48;
      CSHA256::Write(&hash_obj->ctx,(uchar *)&local_a0,4);
      local_a0 = (_Base_ptr)CONCAT44(local_a0._4_4_,local_70);
      CSHA256::Write(&hash_obj->ctx,(uchar *)&local_a0,4);
      local_a0 = local_98;
      CSHA256::Write(&hash_obj->ctx,(uchar *)&local_a0,8);
      SerializeMany<HashWriter,prevector<28u,unsigned_char,unsigned_int,int>>
                (hash_obj,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          &local_90.indirect_contents);
      if (0x1c < local_74) {
        free(local_90.indirect_contents.indirect);
        local_90.indirect_contents.indirect = (char *)0x0;
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ApplyHash(T& hash_obj, const Txid& hash, const std::map<uint32_t, Coin>& outputs)
{
    for (auto it = outputs.begin(); it != outputs.end(); ++it) {
        COutPoint outpoint = COutPoint(hash, it->first);
        Coin coin = it->second;
        ApplyCoinHash(hash_obj, outpoint, coin);
    }
}